

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

Reg asm_fuseloadk64(ASMState *as,IRIns *ir)

{
  MCode *pMVar1;
  IRIns *pIVar2;
  int iVar3;
  uint64_t *k;
  IRIns *ir_local;
  ASMState *as_local;
  
  pIVar2 = ir + 1;
  iVar3 = (int)pIVar2;
  if (pIVar2 == (IRIns *)(long)iVar3) {
    (as->mrm).ofs = iVar3;
    (as->mrm).base = 0x80;
  }
  else if ((long)pIVar2 - (long)&as->J[1].L == (long)(iVar3 - ((int)as->J + 0xca8))) {
    (as->mrm).ofs = iVar3 - ((int)as->J + 0xca8);
    (as->mrm).base = '\x0e';
  }
  else if (((((long)pIVar2 - (long)as->mcp == (long)(iVar3 - (int)as->mcp)) &&
            ((long)ir + (0x10 - (long)as->mcp) == (long)((iVar3 + 8) - (int)as->mcp))) &&
           ((long)pIVar2 - (long)as->mctop == (long)(iVar3 - (int)as->mctop))) &&
          ((long)ir + (0x10 - (long)as->mctop) == (long)((iVar3 + 8) - (int)as->mctop))) {
    (as->mrm).ofs = iVar3 - (int)as->mcp;
    (as->mrm).base = '%';
  }
  else {
    if ((ir->field_1).op12 == 0) {
      while (((ulong)as->mcbot & 7) != 0) {
        pMVar1 = as->mcbot;
        as->mcbot = pMVar1 + 1;
        *pMVar1 = 0xcc;
      }
      *(IRIns *)as->mcbot = *pIVar2;
      (ir->field_1).op12 = (int)as->mctop - (int)as->mcbot;
      as->mcbot = as->mcbot + 8;
      as->mclim = as->mcbot + 0x40;
      as->J->mcbot = as->mcbot;
    }
    (as->mrm).ofs = ((int)as->mctop - (ir->field_1).op12) - (int)as->mcp;
    (as->mrm).base = '%';
  }
  (as->mrm).idx = 0x80;
  return 0x20;
}

Assistant:

static Reg asm_fuseloadk64(ASMState *as, IRIns *ir)
{
  const uint64_t *k = &ir_k64(ir)->u64;
  if (!LJ_GC64 || checki32((intptr_t)k)) {
    as->mrm.ofs = ptr2addr(k);
    as->mrm.base = RID_NONE;
#if LJ_GC64
  } else if (checki32(dispofs(as, k))) {
    as->mrm.ofs = (int32_t)dispofs(as, k);
    as->mrm.base = RID_DISPATCH;
  } else if (checki32(mcpofs(as, k)) && checki32(mcpofs(as, k+1)) &&
	     checki32(mctopofs(as, k)) && checki32(mctopofs(as, k+1))) {
    as->mrm.ofs = (int32_t)mcpofs(as, k);
    as->mrm.base = RID_RIP;
  } else {  /* Intern 64 bit constant at bottom of mcode. */
    if (ir->i) {
      lj_assertA(*k == *(uint64_t*)(as->mctop - ir->i),
		 "bad interned 64 bit constant");
    } else {
      while ((uintptr_t)as->mcbot & 7) *as->mcbot++ = XI_INT3;
      *(uint64_t*)as->mcbot = *k;
      ir->i = (int32_t)(as->mctop - as->mcbot);
      as->mcbot += 8;
      as->mclim = as->mcbot + MCLIM_REDZONE;
      lj_mcode_commitbot(as->J, as->mcbot);
    }
    as->mrm.ofs = (int32_t)mcpofs(as, as->mctop - ir->i);
    as->mrm.base = RID_RIP;
#endif
  }
  as->mrm.idx = RID_NONE;
  return RID_MRM;
}